

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Lib::SmartPtr<Kernel::ApplicativeArgsIt>_>::Stack
          (Stack<Lib::SmartPtr<Kernel::ApplicativeArgsIt>_> *this,size_t initialCapacity)

{
  SmartPtr<Kernel::ApplicativeArgsIt> *pSVar1;
  size_t sVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    sVar2 = 0;
    pSVar1 = (SmartPtr<Kernel::ApplicativeArgsIt> *)0x0;
  }
  else {
    pSVar1 = (SmartPtr<Kernel::ApplicativeArgsIt> *)Lib::alloc(initialCapacity << 4);
    sVar2 = this->_capacity;
  }
  this->_stack = pSVar1;
  this->_cursor = pSVar1;
  this->_end = pSVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }